

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vulnerabilitytocsv.cpp
# Opt level: O0

void doit(bool skipheader,bool index_file)

{
  FILE *__stream;
  size_t sVar1;
  int local_70;
  uint local_6c;
  int i_1;
  Vulnerability q;
  int damage_bins;
  size_t i;
  undefined1 auStack_48 [4];
  VulnerabilityIndex idx;
  FILE *finy;
  FILE *finx;
  char *idxFileName;
  char *binFileName;
  bool index_file_local;
  bool skipheader_local;
  
  if (!skipheader) {
    printf("vulnerability_id,intensity_bin_id,damage_bin_id,probability\n");
  }
  if (index_file) {
    __stream = fopen("vulnerability.bin","rb");
    idx.original_size = (longlong)fopen("vulnerability.idx","rb");
    if ((FILE *)idx.original_size == (FILE *)0x0) {
      fprintf(_stderr,"FATAL: Vulnerability idx open failed\n");
      exit(1);
    }
    register0x00000000 = fread((void *)((long)&i + 4),0x1c,1,(FILE *)idx.original_size);
    while (stack0xffffffffffffffa8 != 0) {
      fseek(__stream,_auStack_48,0);
      printrows(i._4_4_,(FILE *)__stream,idx.offset);
      register0x00000000 = fread((void *)((long)&i + 4),0x1c,1,(FILE *)idx.original_size);
    }
    fclose(__stream);
    fclose((FILE *)idx.original_size);
  }
  else {
    fread(&q.damage_bin_id,4,1,_stdin);
    sVar1 = fread(&local_6c,0x10,1,_stdin);
    local_70 = (int)sVar1;
    while (local_70 != 0) {
      printf("%d, %d, %d, %.10e\n",(double)(float)q.intensity_bin_id,(ulong)local_6c,
             (ulong)(uint)i_1,(ulong)(uint)q.vulnerability_id);
      sVar1 = fread(&local_6c,0x10,1,_stdin);
      local_70 = (int)sVar1;
    }
  }
  return;
}

Assistant:

void doit(bool skipheader, bool index_file)
{

	if (skipheader == false) {
		printf("vulnerability_id,intensity_bin_id,damage_bin_id,"
		       "probability\n");
	}

	if (index_file) {

		const char *binFileName = "vulnerability.bin";
		const char *idxFileName = "vulnerability.idx";
		FILE *finx = fopen(binFileName, "rb");
		FILE *finy = fopen(idxFileName, "rb");
		if (finy == nullptr) {
			fprintf(stderr,
				"FATAL: Vulnerability idx open failed\n");
			exit(EXIT_FAILURE);
		}

		VulnerabilityIndex idx;
		size_t i = fread(&idx, sizeof(idx), 1, finy);
		while (i != 0) {
			flseek(finx, idx.offset, SEEK_SET);
			printrows(idx.vulnerability_id, finx, idx.size);
			i = fread(&idx, sizeof(idx), 1, finy);
		}

		fclose(finx);
		fclose(finy);

	} else {

		int damage_bins;
		// Drop the bins
		fread(&damage_bins, sizeof(damage_bins), 1, stdin);

		Vulnerability q;
		int i = fread(&q, sizeof(q), 1, stdin);
		while (i != 0) {
			printf("%d, %d, %d, %.10e\n", q.vulnerability_id,
			       q.intensity_bin_id, q.damage_bin_id,
			       q.probability);
			i = fread(&q, sizeof(q), 1, stdin);
		}

	}

}